

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Little_Hexy.cpp
# Opt level: O1

vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *
chrono::copter::Little_Hexy::getPosVect(void)

{
  int i;
  int iVar1;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *in_RDI;
  double dVar2;
  undefined1 auVar3 [16];
  undefined8 in_XMM2_Qb;
  ChVector<double> pos;
  value_type local_38;
  
  (in_RDI->super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = 0;
  do {
    auVar3._0_8_ = (double)iVar1 / 3.0;
    auVar3._8_8_ = in_XMM2_Qb;
    auVar3 = vfmadd132sd_fma(auVar3,ZEXT816(0x3fe0c152382d7365),ZEXT816(0x400921fb54442d18));
    dVar2 = cos(auVar3._0_8_);
    local_38.m_data[1] = sin(auVar3._0_8_);
    local_38.m_data[1] = local_38.m_data[1] * 0.762;
    local_38.m_data[2] = 0.279;
    local_38.m_data[0] = dVar2 * 0.762;
    std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
              (in_RDI,&local_38);
    iVar1 = iVar1 + 1;
  } while (iVar1 != 6);
  return in_RDI;
}

Assistant:

std::vector<ChVector<>> Little_Hexy::getPosVect() {
    std::vector<ChVector<>> ppos;
    for (int i = 0; i < 6; i++) {
        double ang = CH_C_PI * (i / 3.0) + CH_C_PI / 6;
        double R = 0.762;
        ChVector<> pos(std::cos(ang) * R, std::sin(ang) * R, 0.279);
        ppos.push_back(pos);
    }
    return ppos;
}